

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O2

ObjNative * newNative(NativeFn function)

{
  ObjNative *pOVar1;
  
  pOVar1 = (ObjNative *)allocateObject(0x18,OBJ_NATIVE);
  pOVar1->function = function;
  return pOVar1;
}

Assistant:

ObjNative *newNative(NativeFn function) {
    ObjNative *native = ALLOCATE_OBJ(ObjNative, OBJ_NATIVE);
    native->function = function;
    return native;
}